

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O2

void tools::xar::close_non_std_fds(void)

{
  int __fd;
  int __fd_00;
  DIR *__dirp;
  dirent *pdVar1;
  
  __fd = open("/proc/self/fd",0x10000);
  if ((-1 < __fd) && (__dirp = fdopendir(__fd), __dirp != (DIR *)0x0)) {
    while (pdVar1 = readdir(__dirp), pdVar1 != (dirent *)0x0) {
      if (((pdVar1->d_name[0] != '.') ||
          ((pdVar1->d_name[1] != '\0' && ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0')))
           ))) && (__fd_00 = atoi(pdVar1->d_name), 2 < __fd_00 && __fd_00 != __fd)) {
        close(__fd_00);
      }
    }
    closedir(__dirp);
    return;
  }
  return;
}

Assistant:

void tools::xar::close_non_std_fds() {
  auto dir_fd = open("/proc/self/fd", O_RDONLY | O_DIRECTORY);
  DIR* dir_handle = nullptr;
  if (dir_fd >= 0 && (dir_handle = fdopendir(dir_fd))) {
    for (auto dent = readdir(dir_handle); dent; dent = readdir(dir_handle)) {
      if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
        continue;
      }

      int fd = std::atoi(dent->d_name);
      if (fd != dir_fd && fd > 2) {
        close(fd);
      }
    }
    closedir(dir_handle);
  }
}